

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O3

void icu_63::number::impl::PatternStringUtils::patternInfoToStringBuilder
               (AffixPatternProvider *patternInfo,bool isPrefix,int8_t signum,
               UNumberSignDisplay signDisplay,Form plural,bool perMilleReplacesPercent,
               UnicodeString *output)

{
  ushort uVar1;
  byte bVar2;
  ushort uVar3;
  UChar UVar4;
  int iVar5;
  int iVar6;
  UChar UVar7;
  Form FVar8;
  uint uVar9;
  undefined3 in_register_00000089;
  byte bVar10;
  int iVar11;
  byte local_48;
  UChar local_42;
  Form local_40;
  undefined4 local_3c;
  AffixPatternProvider *local_38;
  
  local_3c = CONCAT31(in_register_00000089,perMilleReplacesPercent);
  if (signum == -1) {
    uVar9 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
    bVar2 = (byte)uVar9;
    FVar8 = (uVar9 & 0xff) << 9;
    local_48 = 0;
  }
  else {
    if (((signDisplay == UNUM_SIGN_ALWAYS) || (signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS)) ||
       (signDisplay - UNUM_SIGN_EXCEPT_ZERO < 2 && signum == '\x01')) {
      iVar5 = (*patternInfo->_vptr_AffixPatternProvider[6])(patternInfo);
      local_48 = (byte)iVar5 ^ 1;
    }
    else {
      local_48 = 0;
    }
    iVar5 = (*patternInfo->_vptr_AffixPatternProvider[7])(patternInfo);
    bVar2 = 0;
    if ((char)iVar5 == '\0') {
      FVar8 = ZERO;
    }
    else {
      iVar5 = (*patternInfo->_vptr_AffixPatternProvider[8])(patternInfo);
      bVar2 = (byte)iVar5 & local_48;
      FVar8 = (uint)bVar2 << 9;
    }
  }
  local_40 = FVar8 | 0x100;
  if (!isPrefix) {
    local_40 = FVar8;
  }
  if (plural == COUNT) {
    plural = ZERO;
  }
  local_40 = plural | local_40;
  bVar10 = 0;
  if (isPrefix && bVar2 == 0) {
    bVar10 = signDisplay != UNUM_SIGN_NEVER;
    if (signum != -1) {
      bVar10 = local_48;
    }
  }
  local_38 = patternInfo;
  iVar5 = (*patternInfo->_vptr_AffixPatternProvider[3])(patternInfo,(ulong)local_40);
  uVar9 = (uint)bVar10;
  uVar1 = (output->fUnion).fStackFields.fLengthAndFlags;
  uVar3 = 2;
  if ((uVar1 & 1) == 0) {
    uVar3 = uVar1 & 0x1e;
  }
  (output->fUnion).fStackFields.fLengthAndFlags = uVar3;
  iVar11 = iVar5 + uVar9;
  if (iVar11 != 0 && SCARRY4(iVar5,uVar9) == iVar11 < 0) {
    iVar5 = 0;
    do {
      UVar4 = L'-';
      if ((bVar10 & iVar5 == 0) == 0) {
        iVar6 = (*local_38->_vptr_AffixPatternProvider[2])
                          (local_38,(ulong)local_40,(ulong)(iVar5 - uVar9));
        UVar4 = (UChar)iVar6;
      }
      UVar7 = L'+';
      if (UVar4 != L'-') {
        UVar7 = UVar4;
      }
      if (local_48 != 0) {
        UVar4 = UVar7;
      }
      local_42 = UVar4;
      if ((char)local_3c != '\0') {
        local_42 = L'‰';
      }
      if (UVar4 != L'%') {
        local_42 = UVar4;
      }
      UnicodeString::doAppend(output,&local_42,0,1);
      iVar5 = iVar5 + 1;
    } while (iVar11 != iVar5);
  }
  return;
}

Assistant:

void PatternStringUtils::patternInfoToStringBuilder(const AffixPatternProvider& patternInfo, bool isPrefix,
                                                    int8_t signum, UNumberSignDisplay signDisplay,
                                                    StandardPlural::Form plural,
                                                    bool perMilleReplacesPercent, UnicodeString& output) {

    // Should the output render '+' where '-' would normally appear in the pattern?
    bool plusReplacesMinusSign = signum != -1 && (
            signDisplay == UNUM_SIGN_ALWAYS || signDisplay == UNUM_SIGN_ACCOUNTING_ALWAYS || (
                    signum == 1 && (
                            signDisplay == UNUM_SIGN_EXCEPT_ZERO ||
                            signDisplay == UNUM_SIGN_ACCOUNTING_EXCEPT_ZERO))) &&
                                 patternInfo.positiveHasPlusSign() == false;

    // Should we use the affix from the negative subpattern? (If not, we will use the positive
    // subpattern.)
    bool useNegativeAffixPattern = patternInfo.hasNegativeSubpattern() && (
            signum == -1 || (patternInfo.negativeHasMinusSign() && plusReplacesMinusSign));

    // Resolve the flags for the affix pattern.
    int flags = 0;
    if (useNegativeAffixPattern) {
        flags |= AffixPatternProvider::AFFIX_NEGATIVE_SUBPATTERN;
    }
    if (isPrefix) {
        flags |= AffixPatternProvider::AFFIX_PREFIX;
    }
    if (plural != StandardPlural::Form::COUNT) {
        U_ASSERT(plural == (AffixPatternProvider::AFFIX_PLURAL_MASK & plural));
        flags |= plural;
    }

    // Should we prepend a sign to the pattern?
    bool prependSign;
    if (!isPrefix || useNegativeAffixPattern) {
        prependSign = false;
    } else if (signum == -1) {
        prependSign = signDisplay != UNUM_SIGN_NEVER;
    } else {
        prependSign = plusReplacesMinusSign;
    }

    // Compute the length of the affix pattern.
    int length = patternInfo.length(flags) + (prependSign ? 1 : 0);

    // Finally, set the result into the StringBuilder.
    output.remove();
    for (int index = 0; index < length; index++) {
        char16_t candidate;
        if (prependSign && index == 0) {
            candidate = u'-';
        } else if (prependSign) {
            candidate = patternInfo.charAt(flags, index - 1);
        } else {
            candidate = patternInfo.charAt(flags, index);
        }
        if (plusReplacesMinusSign && candidate == u'-') {
            candidate = u'+';
        }
        if (perMilleReplacesPercent && candidate == u'%') {
            candidate = u'‰';
        }
        output.append(candidate);
    }
}